

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<unsigned_long>
               (unsigned_long *list,uint32 length,CompareVarsInfo *cvInfo)

{
  bool bVar1;
  unsigned_long local_40;
  unsigned_long item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  unsigned_long *puStack_10;
  uint32 length_local;
  unsigned_long *list_local;
  
  _lowerBound = cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)cvInfo;
  cvInfo_local._4_4_ = length;
  puStack_10 = list;
  for (insertPoint = 1; insertPoint < cvInfo_local._4_4_; insertPoint = insertPoint + 1) {
    local_40 = puStack_10[insertPoint];
    item._0_4_ = insertPoint;
    item._4_4_ = insertPoint - 1;
    upperBound = 0;
    while( true ) {
      bVar1 = (*_lowerBound)((CompareVarsInfo *)compareType,&local_40,puStack_10 + item._4_4_);
      if (bVar1) {
        item._0_4_ = item._4_4_;
      }
      else {
        upperBound = item._4_4_ + 1;
      }
      if ((uint)item <= upperBound) break;
      item._4_4_ = upperBound + ((uint)item - upperBound >> 1);
    }
    for (item._4_4_ = insertPoint; upperBound < item._4_4_; item._4_4_ = item._4_4_ - 1) {
      puStack_10[item._4_4_] = puStack_10[item._4_4_ - 1];
    }
    puStack_10[upperBound] = local_40;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }